

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemFromBtree(BtCursor *pCur,u32 offset,u32 amt,Mem *pMem)

{
  u8 *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  puVar1 = (pCur->info).pPayload;
  uVar3 = *(int *)&pCur->apPage[pCur->iPage]->aDataEnd - (int)puVar1;
  uVar4 = (uint)(pCur->info).nLocal;
  if (uVar4 < uVar3) {
    uVar3 = uVar4;
  }
  if (uVar3 < amt + offset) {
    iVar2 = vdbeMemFromBtreeResize(pCur,offset,amt,pMem);
    return iVar2;
  }
  pMem->z = (char *)(puVar1 + offset);
  pMem->flags = 0x1010;
  pMem->n = amt;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFromBtree(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  u32 offset,       /* Offset from the start of data to return bytes from. */
  u32 amt,          /* Number of bytes to return. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  char *zData;        /* Data from the btree layer */
  u32 available = 0;  /* Number of bytes available on the local btree page */
  int rc = SQLITE_OK; /* Return code */

  assert( sqlite3BtreeCursorIsValid(pCur) );
  assert( !VdbeMemDynamic(pMem) );

  /* Note: the calls to BtreeKeyFetch() and DataFetch() below assert() 
  ** that both the BtShared and database handle mutexes are held. */
  assert( (pMem->flags & MEM_RowSet)==0 );
  zData = (char *)sqlite3BtreePayloadFetch(pCur, &available);
  assert( zData!=0 );

  if( offset+amt<=available ){
    pMem->z = &zData[offset];
    pMem->flags = MEM_Blob|MEM_Ephem;
    pMem->n = (int)amt;
  }else{
    rc = vdbeMemFromBtreeResize(pCur, offset, amt, pMem);
  }

  return rc;
}